

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

void separate_version(char *name,char *ver,int checkp)

{
  ulong uVar1;
  char *pcVar2;
  char **local_60;
  char *lfn_cp;
  char ver_buf [16];
  size_t len;
  char *pcStack_38;
  uint ver_no;
  char *cp;
  char *end;
  char *start;
  int checkp_local;
  char *ver_local;
  char *name_local;
  
  cp = strchr(name,0x7e);
  end = cp;
  pcVar2 = cp;
  if (cp == (char *)0x0) {
    pcVar2 = strchr(name,0x25);
    if (pcVar2 != (char *)0x0) {
      strcpy(ver,"0");
      return;
    }
  }
  else {
    while (pcStack_38 = pcVar2 + 1, *pcStack_38 != '\0') {
      pcVar2 = pcStack_38;
      if (*pcStack_38 == '~') {
        end = cp;
        cp = pcStack_38;
      }
    }
    if (((end != cp) && (end[-1] == '.')) && (cp == pcVar2)) {
      ver_buf._8_8_ = cp + (-1 - (long)end);
      strncpy((char *)&lfn_cp,end + 1,ver_buf._8_8_);
      ver_buf[ver_buf._8_8_ + -8] = '\0';
      if (checkp == 0) {
        end[-1] = '\0';
        strcpy(ver,(char *)&lfn_cp);
        return;
      }
      if ((char)lfn_cp != '\0') {
        local_60 = &lfn_cp;
        while( true ) {
          if (*(char *)local_60 == '\0') {
            end[-1] = '\0';
            *cp = '\0';
            uVar1 = strtoul(end + 1,(char **)0x0,10);
            sprintf((char *)&lfn_cp,"%u",uVar1 & 0xffffffff);
            strcpy(ver,(char *)&lfn_cp);
            return;
          }
          if ((*(char *)local_60 < '0') || ('9' < *(char *)local_60)) break;
          local_60 = (char **)((long)local_60 + 1);
        }
      }
    }
  }
  *ver = '\0';
  return;
}

Assistant:

void separate_version(char *name, char *ver, int checkp)
{
  char *start, *end, *cp;
  unsigned ver_no;
  size_t len;
  char ver_buf[VERSIONLEN];

  if ((end = (char *)strchr(name, '~')) != (char *)NULL) {
    start = end;
    cp = end + 1;
    while (*cp) {
      if (*cp == '~') {
        start = end;
        end = cp;
      }
      cp++;
    }

    if (start != end && *(start - 1) == '.' && end == (cp - 1)) {
      /*
       * name ends in the form ".~###~". But we have to check
       * ### are all numbers or not, if checkp is 1.
       */
      len = (end - start) - 1;
      strncpy(ver_buf, start + 1, len);
      ver_buf[len] = '\0';
      if (checkp) {
        NumericStringP(ver_buf, YES, NO);
      YES:
        /*
         * name contains a valid version field.
         */
        *(start - 1) = '\0';
        *end = '\0';
        /*
         * Use strtoul() to eliminate leading 0s.
         */
        ver_no = strtoul(start + 1, (char **)NULL, 10);
        sprintf(ver_buf, "%u", ver_no);
        strcpy(ver, ver_buf);
        return;
      } else {
        *(start - 1) = '\0';
        strcpy(ver, ver_buf);
        return;
      }
    }
  } else if (strchr(name, '%')) {
    strcpy(ver, "0");
    return;
  }
NO:
  /* name does not contain a valid version field. */
  *ver = '\0';
}